

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O1

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<0>::
DecodeInternal<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
          (DynamicIntegerPointsKdTreeDecoder<0> *this,uint32_t num_points,
          ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
          *oit)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  ulong *puVar4;
  uint32_t *puVar5;
  pointer puVar6;
  pointer puVar7;
  uint *puVar8;
  pointer pvVar9;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  *pCVar10;
  long lVar11;
  bool bVar12;
  byte bVar13;
  uint32_t uVar14;
  uint uVar15;
  _Elt_pointer pDVar16;
  ulong uVar17;
  VectorUint32 *levels;
  uint32_t uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar22;
  ulong uVar23;
  bool bVar24;
  uint32_t number;
  DecodingStatus init_status;
  stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
  status_stack;
  bool local_e9;
  DecodingStatus local_e8;
  ulong local_d8;
  ulong local_d0;
  uint32_t local_c4;
  uint32_t local_c0;
  DecodingStatus local_bc;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  *local_b0;
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
  local_a8;
  ulong local_50;
  long local_48;
  DirectBitDecoder *local_40;
  DirectBitDecoder *local_38;
  
  local_e8._0_8_ = local_e8._0_8_ & 0xffffffff00000000;
  local_c4 = num_points;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)this->dimension_,&local_e8.num_remaining_points,(allocator_type *)&local_bc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->base_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_a8);
  if (local_a8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_a8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_a8._M_impl.super__Deque_impl_data._M_map);
  }
  local_e8._0_8_ = local_e8._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)this->dimension_,&local_e8.num_remaining_points,(allocator_type *)&local_bc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->levels_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_a8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_a8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_a8._M_impl.super__Deque_impl_data._M_map);
  }
  local_bc.num_remaining_points = local_c4;
  local_bc.last_axis = 0;
  local_bc.stack_pos = 0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
  ::_M_initialize_map(&local_a8,0);
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>>
    ::_M_push_back_aux<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus_const&>
              ((deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>>
                *)&local_a8,&local_bc);
  }
  else {
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->stack_pos = local_bc.stack_pos;
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->num_remaining_points =
         local_bc.num_remaining_points;
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->last_axis = local_bc.last_axis;
    local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  local_e9 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
             local_a8._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (!local_e9) {
    local_40 = &this->numbers_decoder_;
    local_38 = &this->remaining_bits_decoder_;
    local_b0 = oit;
    do {
      pDVar16 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pDVar16 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
      }
      uVar18 = pDVar16[-1].num_remaining_points;
      uVar14 = pDVar16[-1].last_axis;
      uVar23 = (ulong)pDVar16[-1].stack_pos;
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first,0x1f8);
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x2a;
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x29;
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      uVar15 = 1;
      if (uVar18 <= local_c4) {
        pvVar22 = (this->base_stack_).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar23;
        levels = (this->levels_stack_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar23;
        local_d8 = uVar23;
        uVar14 = GetAxis(this,uVar18,levels,uVar14);
        pCVar10 = local_b0;
        if (uVar14 < this->dimension_) {
          uVar2 = (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar14];
          uVar3 = this->bit_length_;
          if (uVar3 == uVar2) {
            uVar15 = 0;
            for (; uVar18 != 0; uVar18 = uVar18 - 1) {
              puVar4 = (ulong *)(pvVar22->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start;
              local_e8._0_8_ = *puVar4;
              local_e8.stack_pos = (uint32_t)puVar4[1];
              std::
              vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
              ::emplace_back<draco::VectorD<unsigned_int,3>>
                        ((vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                          *)(pCVar10->oit_).container,(VectorD<unsigned_int,_3> *)&local_e8);
              this->num_decoded_points_ = this->num_decoded_points_ + 1;
            }
          }
          else if (uVar18 < 3) {
            puVar5 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            *puVar5 = uVar14;
            uVar23 = (ulong)this->dimension_;
            if (1 < this->dimension_) {
              uVar14 = *puVar5;
              uVar17 = 1;
              do {
                bVar24 = uVar14 == (int)uVar23 - 1U;
                uVar14 = uVar14 + 1;
                if (bVar24) {
                  uVar14 = 0;
                }
                puVar5[uVar17] = uVar14;
                uVar17 = uVar17 + 1;
                uVar23 = (ulong)this->dimension_;
              } while (uVar17 < uVar23);
            }
            if (uVar18 != 0) {
              uVar14 = 0;
              do {
                bVar24 = this->dimension_ != 0;
                uVar15 = 0xd;
                if (bVar24) {
                  local_d8 = CONCAT44(local_d8._4_4_,uVar14);
                  uVar23 = 0;
                  do {
                    puVar6 = (this->p_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    puVar7 = (this->axes_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    puVar6[puVar7[uVar23]] = 0;
                    uVar15 = puVar7[uVar23];
                    iVar20 = this->bit_length_ -
                             (levels->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar15];
                    if ((iVar20 != 0) &&
                       (bVar12 = DirectBitDecoder::DecodeLeastSignificantBits32
                                           (local_38,iVar20,puVar6 + uVar15), !bVar12)) {
                      uVar15 = 1;
                      goto LAB_0015d0e3;
                    }
                    uVar15 = (this->axes_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar23];
                    puVar8 = (this->p_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + uVar15;
                    *puVar8 = *puVar8 | (pvVar22->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar15];
                    uVar23 = uVar23 + 1;
                    bVar24 = uVar23 < this->dimension_;
                  } while (bVar24);
                  uVar15 = 0xd;
LAB_0015d0e3:
                  uVar14 = (uint32_t)local_d8;
                }
                if (bVar24) goto LAB_0015d12b;
                puVar4 = (ulong *)(this->p_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                local_e8._0_8_ = *puVar4;
                local_e8.stack_pos = (uint32_t)puVar4[1];
                std::
                vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                ::emplace_back<draco::VectorD<unsigned_int,3>>
                          ((vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                            *)(local_b0->oit_).container,(VectorD<unsigned_int,_3> *)&local_e8);
                this->num_decoded_points_ = this->num_decoded_points_ + 1;
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar18);
            }
            uVar15 = 10;
LAB_0015d12b:
            if (uVar15 == 10) {
              uVar15 = 0;
            }
          }
          else if (this->num_decoded_points_ <= this->num_points_) {
            local_50 = (ulong)((int)local_d8 + 1);
            local_48 = local_50 * 3;
            local_d0 = (ulong)uVar14;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((this->base_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_50,pvVar22);
            lVar11 = local_48;
            piVar1 = (int *)(*(long *)((long)&(((this->base_stack_).
                                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              )._M_impl.super__Vector_impl_data + local_48 * 8) +
                            local_d0 * 4);
            *piVar1 = *piVar1 + (1 << ((char)uVar3 + ~(byte)uVar2 & 0x1f));
            uVar15 = 1;
            iVar20 = 0x1f;
            if (uVar18 != 0) {
              for (; uVar18 >> iVar20 == 0; iVar20 = iVar20 + -1) {
              }
            }
            local_c0 = 0;
            DirectBitDecoder::DecodeLeastSignificantBits32(local_40,iVar20,&local_c0);
            iVar20 = (uVar18 >> 1) - local_c0;
            if (local_c0 <= uVar18 >> 1) {
              iVar19 = uVar18 - iVar20;
              iVar21 = iVar20;
              if (iVar20 != iVar19) {
                puVar8 = (this->half_decoder_).pos_._M_current;
                if (puVar8 == (this->half_decoder_).bits_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish) {
                  bVar13 = 0;
                }
                else {
                  uVar18 = (this->half_decoder_).num_used_bits_;
                  bVar13 = (byte)((*puVar8 << ((byte)uVar18 & 0x1f)) >> 0x1f);
                  uVar18 = uVar18 + 1;
                  (this->half_decoder_).num_used_bits_ = uVar18;
                  if (uVar18 == 0x20) {
                    (this->half_decoder_).pos_._M_current = puVar8 + 1;
                    (this->half_decoder_).num_used_bits_ = 0;
                  }
                }
                if (bVar13 == 0) {
                  iVar21 = iVar19;
                  iVar19 = iVar20;
                }
              }
              pvVar9 = (this->levels_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar22 = pvVar9 + local_d8;
              puVar6 = (pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + local_d0;
              *puVar6 = *puVar6 + 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         ((long)&(pvVar9->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data + lVar11 * 8),pvVar22);
              if (iVar21 != 0) {
                local_e8.last_axis = uVar14;
                local_e8.num_remaining_points = iVar21;
                local_e8.stack_pos = (uint32_t)local_d8;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
                            *)&local_a8,&local_e8);
              }
              uVar15 = 0;
              if (iVar19 != 0) {
                local_e8.last_axis = uVar14;
                local_e8.num_remaining_points = iVar19;
                local_e8.stack_pos = (uint32_t)local_50;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
                            *)&local_a8,&local_e8);
              }
            }
          }
        }
      }
    } while (((uVar15 & 0xd) == 0) &&
            (local_e9 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_a8._M_impl.super__Deque_impl_data._M_start._M_cur, !local_e9));
  }
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>
  ::~_Deque_base(&local_a8);
  return local_e9;
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodeInternal(
    uint32_t num_points, OutputIteratorT &oit) {
  typedef DecodingStatus Status;
  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  DecodingStatus init_status(num_points, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    const DecodingStatus status = status_stack.top();
    status_stack.pop();

    const uint32_t num_remaining_points = status.num_remaining_points;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    if (num_remaining_points > num_points) {
      return false;
    }

    const uint32_t axis = GetAxis(num_remaining_points, levels, last_axis);
    if (axis >= dimension_) {
      return false;
    }

    const uint32_t level = levels[axis];

    // All axes have been fully subdivided, just output points.
    if ((bit_length_ - level) == 0) {
      for (uint32_t i = 0; i < num_remaining_points; i++) {
        *oit = old_base;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    DRACO_DCHECK_EQ(true, num_remaining_points != 0);

    // Fast decoding of remaining bits if number of points is 1 or 2.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        for (uint32_t j = 0; j < dimension_; j++) {
          p_[axes_[j]] = 0;
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            if (!remaining_bits_decoder_.DecodeLeastSignificantBits32(
                    num_remaining_bits, &p_[axes_[j]])) {
              return false;
            }
          }
          p_[axes_[j]] = old_base[axes_[j]] | p_[axes_[j]];
        }
        *oit = p_;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    if (num_decoded_points_ > num_points_) {
      return false;
    }

    const int num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;         // copy
    base_stack_[stack_pos + 1][axis] += modifier;  // new base

    const int incoming_bits = MostSignificantBit(num_remaining_points);

    uint32_t number = 0;
    DecodeNumber(incoming_bits, &number);

    uint32_t first_half = num_remaining_points / 2;
    if (first_half < number) {
      // Invalid |number|.
      return false;
    }
    first_half -= number;
    uint32_t second_half = num_remaining_points - first_half;

    if (first_half != second_half) {
      if (!half_decoder_.DecodeNextBit()) {
        std::swap(first_half, second_half);
      }
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (first_half) {
      status_stack.push(DecodingStatus(first_half, axis, stack_pos));
    }
    if (second_half) {
      status_stack.push(DecodingStatus(second_half, axis, stack_pos + 1));
    }
  }
  return true;
}